

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanAtts(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  char **ppcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar10;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *local_40;
  char *local_38;
  uint uVar8;
  
  uVar5 = (long)end - (long)ptr;
  if ((long)uVar5 < 1) {
    return -1;
  }
  local_38 = end + -2;
  pcVar10 = end;
  local_40 = (byte *)ptr;
LAB_0045d27f:
  pbVar12 = local_40;
  uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_40);
  uVar7 = uVar8 - 5;
  local_40 = pbVar12;
  if (0x16 < uVar7) goto switchD_0045d2a0_caseD_8;
  ppcVar9 = (char **)((long)&switchD_0045d2a0::switchdataD_005d3ea4 +
                     (long)(int)(&switchD_0045d2a0::switchdataD_005d3ea4)[uVar7]);
  switch(uVar8) {
  case 5:
    if (uVar5 == 1) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[0])(enc,(char *)local_40,pcVar10,ppcVar9);
    local_40 = pbVar12;
    if (iVar4 == 0) goto switchD_0045d2a0_caseD_8;
    local_40 = pbVar12 + 2;
    pcVar10 = extraout_RDX_01;
    break;
  case 6:
    if (uVar5 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[1])(enc,(char *)local_40,pcVar10,ppcVar9);
    local_40 = pbVar12;
    if (iVar4 == 0) goto switchD_0045d2a0_caseD_8;
    local_40 = pbVar12 + 3;
    pcVar10 = extraout_RDX_00;
    break;
  case 7:
    if (uVar5 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[2])(enc,(char *)local_40,pcVar10,ppcVar9);
    local_40 = pbVar12;
    if (iVar4 == 0) goto switchD_0045d2a0_caseD_8;
    local_40 = pbVar12 + 4;
    pcVar10 = extraout_RDX;
    break;
  default:
    goto switchD_0045d2a0_caseD_8;
  case 9:
  case 10:
  case 0x15:
    pbVar12 = local_40 + 1;
    lVar6 = (long)end - (long)pbVar12;
    while( true ) {
      if (lVar6 < 1) {
        return -1;
      }
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar12);
      if ((1 < bVar2 - 9) && (bVar2 != 0x15)) break;
      pbVar12 = pbVar12 + 1;
      lVar6 = lVar6 + -1;
    }
    local_40 = pbVar12;
    if (bVar2 == 0xe) goto switchD_0045d2a0_caseD_e;
    goto switchD_0045d2a0_caseD_8;
  case 0xe:
switchD_0045d2a0_caseD_e:
    pbVar13 = pbVar12 + 1;
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -1;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    uVar7 = (uint)bVar2;
    if ((bVar2 & 0xfe) != 0xc) {
      lVar6 = (long)local_38 - (long)pbVar12;
      do {
        pbVar12 = pbVar13;
        pbVar13 = pbVar12;
        if ((0x15 < (byte)uVar7) || ((0x200600U >> (uVar7 & 0x1f) & 1) == 0))
        goto switchD_0045d3b6_caseD_0;
        if (lVar6 < 1) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)pbVar12[1]);
        uVar7 = (uint)bVar2;
        lVar6 = lVar6 + -1;
        pbVar13 = pbVar12 + 1;
      } while ((bVar2 & 0xfe) != 0xc);
    }
LAB_0045d370:
    local_40 = pbVar12 + 2;
    do {
      while( true ) {
        pbVar12 = local_40;
        uVar5 = (long)end - (long)local_40;
        if ((long)uVar5 < 1) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*local_40);
        if (bVar2 == (byte)uVar7) {
          pbVar13 = local_40 + 1;
          if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
            return -1;
          }
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
          uVar7 = (uint)bVar2;
          if (bVar2 < 0xb) {
            if (1 < uVar7 - 9) goto switchD_0045d3b6_caseD_0;
          }
          else if (bVar2 != 0x15) {
            if (uVar7 == 0xb) goto LAB_0045d672;
            local_40 = pbVar13;
            if (uVar7 == 0x11) goto LAB_0045d641;
            goto switchD_0045d2a0_caseD_8;
          }
          pbVar11 = local_40 + 2;
          if ((byte *)end == pbVar11 || (long)end - (long)pbVar11 < 0) {
            return -1;
          }
          pcVar10 = (char *)0x2;
          lVar6 = 0;
          goto LAB_0045d536;
        }
        uVar8 = (uint)bVar2;
        if (uVar8 < 9) break;
switchD_0045d3b6_caseD_4:
        local_40 = local_40 + 1;
      }
      pbVar13 = pbVar12;
      switch(uVar8) {
      default:
        goto switchD_0045d3b6_caseD_0;
      case 3:
        iVar4 = normal_scanRef(enc,(char *)(local_40 + 1),end,(char **)&local_40);
        if (iVar4 < 1) {
          if (iVar4 != 0) {
            return iVar4;
          }
          goto switchD_0045d2a0_caseD_8;
        }
        break;
      case 4:
        goto switchD_0045d3b6_caseD_4;
      case 5:
        goto switchD_0045d3b6_caseD_5;
      case 6:
        if (uVar5 < 3) {
          return -2;
        }
        pcVar10 = (*enc[3].skipS)(enc,(char *)local_40);
        if ((int)pcVar10 != 0) goto switchD_0045d3b6_caseD_0;
        local_40 = pbVar12 + 3;
        break;
      case 7:
        if (uVar5 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].getAtts)(enc,(char *)local_40,0x5d3f00,
                                  (ATTRIBUTE *)
                                  ((long)&switchD_0045d3b6::switchdataD_005d3f00 +
                                  (long)(int)(&switchD_0045d3b6::switchdataD_005d3f00)[uVar8]));
        if (iVar4 != 0) goto switchD_0045d3b6_caseD_0;
        local_40 = pbVar12 + 4;
      }
    } while( true );
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_40 = local_40 + 1;
  }
  goto LAB_0045d2aa;
LAB_0045d536:
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)local_40[(long)pcVar10])) {
  case 5:
    goto switchD_0045d55e_caseD_5;
  case 6:
    lVar3 = lVar6 - (long)local_40;
    if (end + lVar3 + -2 < (char **)0x3) {
      return -2;
    }
    pbVar1 = local_40 + (2 - lVar6);
    local_40 = pbVar13;
    iVar4 = (*enc[3].literalScanners[1])(enc,(char *)pbVar1,pcVar10,(char **)(end + lVar3 + -2));
    pbVar13 = pbVar11;
    if (iVar4 == 0) goto switchD_0045d3b6_caseD_0;
    local_40 = pbVar12 + (5 - lVar6);
    pcVar10 = extraout_RDX_04;
    goto LAB_0045d2aa;
  case 7:
    lVar3 = lVar6 - (long)local_40;
    if (end + lVar3 + -2 < (char *)0x4) {
      return -2;
    }
    pbVar11 = local_40 + (2 - lVar6);
    local_40 = pbVar13;
    iVar4 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar11,pcVar10,end + lVar3 + -2);
    pbVar13 = pbVar11;
    if (iVar4 == 0) goto switchD_0045d3b6_caseD_0;
    local_40 = pbVar12 + (6 - lVar6);
    pcVar10 = extraout_RDX_02;
    goto LAB_0045d2aa;
  default:
    pbVar13 = local_40 + (2 - lVar6);
    goto switchD_0045d3b6_caseD_0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_0045d55e_caseD_9;
  case 0xb:
    pbVar13 = local_40 + (2 - lVar6);
LAB_0045d672:
    local_40 = pbVar13 + 1;
    iVar4 = 1;
    break;
  case 0x11:
    pbVar13 = local_40 + (2 - lVar6);
LAB_0045d641:
    local_40 = pbVar13 + 1;
    if ((byte *)end == local_40 || (long)end - (long)local_40 < 0) {
      return -1;
    }
    if (pbVar13[1] == 0x3e) {
      local_40 = pbVar13 + 2;
    }
    iVar4 = (uint)(pbVar13[1] == 0x3e) * 3;
    break;
  case 0x16:
  case 0x18:
    local_40 = local_40 + (3 - lVar6);
    goto LAB_0045d2aa;
  }
  goto LAB_0045d690;
switchD_0045d55e_caseD_9:
  pbVar11 = pbVar11 + 1;
  lVar3 = lVar6 - (long)local_40;
  lVar6 = lVar6 + -1;
  pcVar10 = pcVar10 + 1;
  if (end + lVar3 == (char *)0x3 || (long)(end + lVar3 + -3) < 0) {
    return -1;
  }
  goto LAB_0045d536;
switchD_0045d3b6_caseD_5:
  if (uVar5 == 1) {
    return -2;
  }
  iVar4 = (*enc[3].nameLength)(enc,(char *)local_40);
  if (iVar4 != 0) goto switchD_0045d3b6_caseD_0;
  goto LAB_0045d370;
switchD_0045d55e_caseD_5:
  lVar3 = lVar6 - (long)local_40;
  if ((char **)(end + lVar3) == (char **)0x3) {
    return -2;
  }
  pbVar1 = local_40 + (2 - lVar6);
  local_40 = pbVar13;
  iVar4 = (*enc[3].literalScanners[0])(enc,(char *)pbVar1,pcVar10,(char **)(end + lVar3));
  pbVar13 = pbVar11;
  if (iVar4 != 0) {
    local_40 = pbVar12 + (4 - lVar6);
    pcVar10 = extraout_RDX_03;
LAB_0045d2aa:
    uVar5 = (long)end - (long)local_40;
    if ((long)uVar5 < 1) {
      return -1;
    }
    goto LAB_0045d27f;
  }
switchD_0045d3b6_caseD_0:
  local_40 = pbVar13;
switchD_0045d2a0_caseD_8:
  iVar4 = 0;
LAB_0045d690:
  *nextTokPtr = (char *)local_40;
  return iVar4;
}

Assistant:

static int PTRCALL
PREFIX(scanAtts)(const ENCODING *enc, const char *ptr, const char *end,
                 const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon = 0;
#endif
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      for (;;) {
        int t;

        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        t = BYTE_TYPE(enc, ptr);
        if (t == BT_EQUALS)
          break;
        switch (t) {
        case BT_S:
        case BT_LF:
        case BT_CR:
          break;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_EQUALS:
      {
        int open;
#ifdef XML_NS
        hadColon = 0;
#endif
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          open = BYTE_TYPE(enc, ptr);
          if (open == BT_QUOT || open == BT_APOS)
            break;
          switch (open) {
          case BT_S:
          case BT_LF:
          case BT_CR:
            break;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
        }
        ptr += MINBPC(enc);
        /* in attribute value */
        for (;;) {
          int t;
          REQUIRE_CHAR(enc, ptr, end);
          t = BYTE_TYPE(enc, ptr);
          if (t == open)
            break;
          switch (t) {
          INVALID_CASES(ptr, nextTokPtr)
          case BT_AMP:
            {
              int tok = PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, &ptr);
              if (tok <= 0) {
                if (tok == XML_TOK_INVALID)
                  *nextTokPtr = ptr;
                return tok;
              }
              break;
            }
          case BT_LT:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          default:
            ptr += MINBPC(enc);
            break;
          }
        }
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_SOL:
          goto sol;
        case BT_GT:
          goto gt;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
        /* ptr points to closing quote */
        for (;;) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_S: case BT_CR: case BT_LF:
            continue;
          case BT_GT:
          gt:
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_START_TAG_WITH_ATTS;
          case BT_SOL:
          sol:
            ptr += MINBPC(enc);
            REQUIRE_CHAR(enc, ptr, end);
            if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
              *nextTokPtr = ptr;
              return XML_TOK_INVALID;
            }
            *nextTokPtr = ptr + MINBPC(enc);
            return XML_TOK_EMPTY_ELEMENT_WITH_ATTS;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          break;
        }
        break;
      }
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}